

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::LateralBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,LateralBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  type expr;
  InternalException *this_00;
  string local_40;
  
  if (depth != 0) {
    ExpressionBinder::BindExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
    if ((__return_storage_ptr__->error).initialized == false) {
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&__return_storage_ptr__->expression);
      ExtractCorrelatedColumns(this,expr);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Lateral binder can only bind correlated columns","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult LateralBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	if (depth == 0) {
		throw InternalException("Lateral binder can only bind correlated columns");
	}
	auto result = ExpressionBinder::BindExpression(expr_ptr, depth);
	if (result.HasError()) {
		return result;
	}
	ExtractCorrelatedColumns(*result.expression);
	return result;
}